

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool range_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *closure;
  gravity_object_t *pgVar1;
  gravity_class_t *pgVar2;
  char *pcVar3;
  bool bVar4;
  _Bool _Var5;
  gravity_fiber_t *fiber;
  nanotime_t nVar6;
  nanotime_t nVar7;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar8;
  gravity_value_t gVar9;
  gravity_value_t gVar10;
  char _buffer [4096];
  gravity_value_t local_1058;
  gravity_value_t local_1048;
  char local_1038 [4];
  char acStack_1034 [4];
  char acStack_1030 [4];
  char acStack_102c [4];
  undefined4 uStack_1028;
  undefined3 uStack_1024;
  undefined5 uStack_1021;
  undefined3 uStack_101c;
  
  if (nargs < 2) {
    uStack_1028 = 0x20666f20;
    uStack_1024 = 0x677261;
    uStack_1021 = 0x746e656d75;
    uStack_101c = 0x2e73;
    local_1038[0] = 'I';
    local_1038[1] = 'n';
    local_1038[2] = 'c';
    local_1038[3] = 'o';
    acStack_1034[0] = 'r';
    acStack_1034[1] = 'r';
    acStack_1034[2] = 'e';
    acStack_1034[3] = 'c';
    acStack_1030[0] = 't';
    acStack_1030[1] = ' ';
    acStack_1030[2] = 'n';
    acStack_1030[3] = 'u';
    acStack_102c[0] = 'm';
    acStack_102c[1] = 'b';
    acStack_102c[2] = 'e';
    acStack_102c[3] = 'r';
  }
  else {
    if (args[1].isa == gravity_class_closure) {
      closure = args[1].field_1.p;
      pgVar1 = (args->field_1).p;
      gVar9 = *args;
      gVar10 = *args;
      pgVar2 = pgVar1->objclass;
      pcVar3 = pgVar1->identifier;
      nVar6 = nanotime();
      if ((long)pgVar2 < (long)pcVar3) {
        aVar8 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)pgVar1->objclass;
        pcVar3 = pgVar1->identifier;
        if (aVar8.n <= (long)pcVar3) {
          do {
            local_1048.isa = gravity_class_int;
            local_1048.field_1 = aVar8;
            _Var5 = gravity_vm_runclosure(vm,(gravity_closure_t *)closure,gVar10,&local_1048,1);
            if (!_Var5) {
              return false;
            }
            aVar8.p = (gravity_object_t *)((long)&(aVar8.p)->isa + 1);
          } while ((gravity_class_t *)(pcVar3 + 1) != (gravity_class_t *)aVar8.n);
        }
      }
      else {
        pcVar3 = pgVar1->identifier;
        aVar8 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)pgVar1->objclass;
        if ((long)pcVar3 <= (long)pgVar1->objclass) {
          do {
            local_1058.isa = gravity_class_int;
            local_1058.field_1 = aVar8;
            _Var5 = gravity_vm_runclosure(vm,(gravity_closure_t *)closure,gVar9,&local_1058,1);
            if (!_Var5) {
              return false;
            }
            bVar4 = (long)pcVar3 < aVar8.n;
            aVar8.p = (gravity_object_t *)(aVar8.n + -1);
          } while (bVar4);
        }
      }
      nVar7 = nanotime();
      gVar10.field_1.p = (gravity_object_t *)(nVar7 - nVar6);
      gVar10.isa = gravity_class_int;
      gravity_vm_setslot(vm,gVar10,rindex);
      return true;
    }
    uStack_1028 = 0x43206120;
    uStack_1024 = 0x736f6c;
    uStack_1021 = 0x2e657275;
    local_1038[0] = 'A';
    local_1038[1] = 'r';
    local_1038[2] = 'g';
    local_1038[3] = 'u';
    acStack_1034[0] = 'm';
    acStack_1034[1] = 'e';
    acStack_1034[2] = 'n';
    acStack_1034[3] = 't';
    acStack_1030[0] = ' ';
    acStack_1030[1] = 'm';
    acStack_1030[2] = 'u';
    acStack_1030[3] = 's';
    acStack_102c[0] = 't';
    acStack_102c[1] = ' ';
    acStack_102c[2] = 'b';
    acStack_102c[3] = 'e';
  }
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,local_1038);
  gVar9.field_1.n = 0;
  gVar9.isa = gravity_class_null;
  gravity_vm_setslot(vm,gVar9,rindex);
  return false;
}

Assistant:

static bool range_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                           // self parameter
    gravity_range_t *range = VALUE_AS_RANGE(value);
    bool is_forward = range->from < range->to;

    nanotime_t t1 = nanotime();
    if (is_forward) {
        register gravity_int_t n = range->to;
        register gravity_int_t i = range->from;
        while (i <= n) {
            if (!gravity_vm_runclosure(vm, closure, value, &VALUE_FROM_INT(i), 1)) return false;
            ++i;
        }
    } else {
        register gravity_int_t n = range->from;            // 5...1
        register gravity_int_t i = range->to;
        while (n >= i) {
            if (!gravity_vm_runclosure(vm, closure, value, &VALUE_FROM_INT(n), 1)) return false;
            --n;
        }
    }
    nanotime_t t2 = nanotime();
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}